

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v8::detail::default_arg_formatter<char32_t>::operator()
          (default_arg_formatter<char32_t> *this,void *value)

{
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar1;
  locale_ref local_50;
  basic_format_specs<char32_t> local_48;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> local_28;
  void *local_20;
  void *value_local;
  default_arg_formatter<char32_t> *this_local;
  
  local_28.container = (this->out).container;
  local_20 = value;
  value_local = this;
  basic_format_specs<char32_t>::basic_format_specs(&local_48);
  locale_ref::locale_ref(&local_50);
  bVar1 = write<char32_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_void,_0>
                    (local_28,value,&local_48,local_50);
  return (iterator)bVar1.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }